

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_data_p.h
# Opt level: O1

array<char,_4UL> __thiscall AlphaCode::decode(AlphaCode *this)

{
  AlphaCode AVar1;
  _Type acVar2;
  array<char,_4UL> aVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  AVar1 = *this;
  uVar5 = (ushort)AVar1 >> 5 & 0x1f;
  uVar6 = (ushort)AVar1 >> 10 | 0x60;
  if (((ushort)AVar1 & 0x7c00) == 0) {
    uVar6 = (ushort)AVar1 & 0x7c00;
  }
  uVar4 = (uVar5 + 0x60) * 0x100;
  if (((ushort)AVar1 >> 5 & 0x1f) == 0) {
    uVar4 = uVar5;
  }
  uVar5 = ((ushort)AVar1 & 0x1f) + 0x60;
  if (((ushort)AVar1 & 0x1f) == 0) {
    uVar5 = (ushort)AVar1 & 0x1f;
  }
  acVar2 = (_Type)(uVar5 | uVar4 | uVar6 << 0x10);
  aVar3._M_elems[0] = acVar2[0];
  aVar3._M_elems[1] = acVar2[1];
  aVar3._M_elems[2] = acVar2[2];
  aVar3._M_elems[3] = acVar2[3];
  return (array<char,_4UL>)aVar3._M_elems;
}

Assistant:

std::array<char, 4> decode() const { return {m2c(c1), m2c(c2), m2c(c3), 0}; }